

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O3

uint * Kit_TruthCompose(CloudManager *dd,uint *pTruth,int nVars,uint **pInputs,int nVarsAll,
                       Vec_Ptr_t *vStore,Vec_Int_t *vNodes)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  int *piVar4;
  void *pvVar5;
  void *pvVar6;
  uint *puVar7;
  uint uVar8;
  int iVar9;
  CloudNode *pFunc;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint *__s;
  ulong uVar14;
  
  Cloud_Restart(dd);
  pFunc = Kit_TruthToCloud_rec(dd,pTruth,nVars,nVars);
  iVar9 = Kit_CreateCloud(dd,pFunc,vNodes);
  if (iVar9 == 0) {
    puts("Kit_TruthCompose(): Internal failure!!!");
  }
  iVar9 = vNodes->nSize;
  if (vStore->nSize < iVar9) {
    __assert_fail("Vec_IntSize(vNodes) <= Vec_PtrSize(vStore)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                  ,0x11a,
                  "unsigned int *Kit_TruthCompose(CloudManager *, unsigned int *, int, unsigned int **, int, Vec_Ptr_t *, Vec_Int_t *)"
                 );
  }
  if (vStore->nSize < 1) {
LAB_005cf9a7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar3 = vStore->pArray;
  __s = (uint *)*ppvVar3;
  uVar8 = 1 << ((char)nVarsAll - 5U & 0x1f);
  if (nVarsAll < 6) {
    uVar8 = 1;
  }
  uVar14 = (ulong)uVar8;
  if (0 < (int)uVar8) {
    memset(__s,0xff,uVar14 * 4);
    iVar9 = vNodes->nSize;
  }
  if (1 < iVar9) {
    piVar4 = vNodes->pArray;
    uVar10 = 1;
    do {
      uVar1 = piVar4[uVar10];
      uVar11 = uVar1 >> 0x11 & 0xfff;
      uVar2 = vStore->nSize;
      if ((((int)uVar2 <= (int)uVar11) || (uVar12 = uVar1 >> 5 & 0xfff, uVar2 <= uVar12)) ||
         (uVar2 <= uVar10)) goto LAB_005cf9a7;
      pvVar5 = ppvVar3[uVar11];
      pvVar6 = ppvVar3[uVar12];
      __s = (uint *)ppvVar3[uVar10];
      puVar7 = pInputs[(int)((~uVar1 | 0xffffffe0) + nVars)];
      if ((uVar1 >> 0x1d & 1) == 0) {
        uVar13 = uVar14 + 1;
        if (0 < (int)uVar8) {
          do {
            uVar2 = *(uint *)((long)pvVar5 + uVar13 * 4 + -8);
            __s[uVar13 - 2] =
                 (*(uint *)((long)pvVar6 + uVar13 * 4 + -8) ^ uVar2) & puVar7[uVar13 - 2] ^ uVar2;
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
      }
      else {
        uVar13 = uVar14 + 1;
        if (0 < (int)uVar8) {
          do {
            uVar2 = puVar7[uVar13 - 2];
            __s[uVar13 - 2] =
                 uVar2 & *(uint *)((long)pvVar6 + uVar13 * 4 + -8) |
                 ~(*(uint *)((long)pvVar5 + uVar13 * 4 + -8) | uVar2);
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)vNodes->nSize);
    if ((0 < (int)uVar8) && ((uVar1 & 0x40000000) != 0)) {
      uVar14 = uVar14 + 1;
      do {
        __s[uVar14 - 2] = ~__s[uVar14 - 2];
        uVar14 = uVar14 - 1;
      } while (1 < uVar14);
    }
  }
  return __s;
}

Assistant:

unsigned * Kit_TruthCompose( CloudManager * dd, unsigned * pTruth, int nVars, 
    unsigned ** pInputs, int nVarsAll, Vec_Ptr_t * vStore, Vec_Int_t * vNodes )
{
    CloudNode * pFunc;
    unsigned * pThis, * pFan0, * pFan1;
    Kit_Mux_t Mux;
    int i, Entry, RetValue;
    // derive BDD from truth table
    Cloud_Restart( dd );
    pFunc = Kit_TruthToCloud( dd, pTruth, nVars );
    // convert it into nodes
    RetValue = Kit_CreateCloud( dd, pFunc, vNodes );
    if ( RetValue == 0 )
        printf( "Kit_TruthCompose(): Internal failure!!!\n" );
    // verify the result
//    pFan0 = Kit_CloudToTruth( vNodes, nVars, vStore, 0 );
//    if ( !Kit_TruthIsEqual( pTruth, pFan0, nVars ) )
//        printf( "Failed!\n" );
    // compute truth table from the BDD
    assert( Vec_IntSize(vNodes) <= Vec_PtrSize(vStore) );
    pThis = (unsigned *)Vec_PtrEntry( vStore, 0 );
    Kit_TruthFill( pThis, nVarsAll );
    Vec_IntForEachEntryStart( vNodes, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
        pFan0 = (unsigned *)Vec_PtrEntry( vStore, Mux.e );
        pFan1 = (unsigned *)Vec_PtrEntry( vStore, Mux.t );
        pThis = (unsigned *)Vec_PtrEntry( vStore, i );
        Kit_TruthMuxPhase( pThis, pFan0, pFan1, pInputs[nVars-1-Mux.v], nVarsAll, Mux.c );
    }
    // complement the result
    if ( Mux.i )
        Kit_TruthNot( pThis, pThis, nVarsAll );
    return pThis;
}